

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::fea::ChElementShellANCF_3443::ComputeNormal
          (ChVector<double> *__return_storage_ptr__,ChElementShellANCF_3443 *this,double xi,
          double eta)

{
  double in_XMM2_Qa;
  double in_XMM4_Qa;
  ChVector<double> r_zeta;
  VectorN Sxi_zeta_compact;
  Matrix3xN e_bar;
  Matrix3xN *local_2a8;
  VectorN *local_2a0;
  ChVector<double> local_298;
  VectorN local_280;
  Matrix3xN local_200;
  
  Calc_Sxi_zeta_compact
            ((ChElementShellANCF_3443 *)__return_storage_ptr__,&local_280,xi,eta,in_XMM2_Qa,
             this->m_thicknessZ,in_XMM4_Qa);
  CalcCoordMatrix(this,&local_200);
  local_2a8 = &local_200;
  local_2a0 = &local_280;
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,1,0,16,1>,0>>
            (&local_298,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_1,_0,_16,_1>,_0>_>
              *)&local_2a8,(type *)0x0);
  ChVector<double>::GetNormalized(__return_storage_ptr__,&local_298);
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChElementShellANCF_3443::ComputeNormal(const double xi, const double eta) {
    VectorN Sxi_zeta_compact;
    Calc_Sxi_zeta_compact(Sxi_zeta_compact, xi, eta, 0, m_thicknessZ, m_midsurfoffset);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // Calculate the position vector gradient with respect to zeta at the current point (whose length may not equal 1)
    ChVector<> r_zeta = e_bar * Sxi_zeta_compact;

    return r_zeta.GetNormalized();
}